

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O0

void __thiscall
particle_decay::perform_decays
          (particle_decay *this,particle_info *mother,
          vector<particle_info,_std::allocator<particle_info>_> *daughter_list)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  int *in_RSI;
  double dVar4;
  vector<particle_info,_std::allocator<particle_info>_> *this_00;
  value_type *__x;
  int decay_part3_monval;
  int decay_part2_monval_1;
  int decay_part1_monval_1;
  particle_info daughter3;
  particle_info daughter2_1;
  particle_info daughter1_1;
  int decay_part2_monval;
  int decay_part1_monval;
  particle_info daughter2;
  particle_info daughter1;
  int N_decay_part;
  int i_channel;
  decay_channel_info *picked_channel;
  double cumulated_branching_ratio;
  double random_local;
  int N_decay_channel;
  particle_decay_info mother_decay_info;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  Random *in_stack_fffffffffffffc50;
  value_type *in_stack_fffffffffffffc58;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_fffffffffffffc60;
  key_type *in_stack_fffffffffffffc88;
  map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
  *in_stack_fffffffffffffc90;
  particle_info *in_stack_fffffffffffffe48;
  particle_info *in_stack_fffffffffffffe50;
  particle_info *in_stack_fffffffffffffe58;
  particle_decay *in_stack_fffffffffffffe60;
  particle_info *in_stack_fffffffffffffef0;
  particle_info *in_stack_fffffffffffffef8;
  particle_info *in_stack_ffffffffffffff00;
  particle_info *in_stack_ffffffffffffff08;
  particle_decay *in_stack_ffffffffffffff10;
  int local_dc;
  reference local_d8;
  double local_d0;
  _Self local_b8 [3];
  _Self local_a0 [11];
  int local_44;
  int local_40;
  vector<decay_channel_info,_std::allocator<decay_channel_info>_> vStack_38;
  int *local_10;
  
  local_10 = in_RSI;
  std::pair<const_int,_particle_decay_info>::anon_struct_128_15_51aee7c3_for_second::
  particle_decay_info((anon_struct_128_15_51aee7c3_for_second *)in_stack_fffffffffffffc50);
  local_a0[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
       ::find((map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
               *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),(key_type *)0x182f1b)
  ;
  local_b8[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
       ::end((map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
              *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
  bVar1 = std::operator==(local_a0,local_b8);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Warning: pdg ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_10);
    poVar2 = std::operator<<(poVar2," not found, might be some table inconsistency");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::
    map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
    ::operator[](in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    std::pair<const_int,_particle_decay_info>::anon_struct_128_15_51aee7c3_for_second::operator=
              ((anon_struct_128_15_51aee7c3_for_second *)in_stack_fffffffffffffc50,
               (anon_struct_128_15_51aee7c3_for_second *)
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    if (local_40 == 1) {
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    else {
      std::__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x183071);
      dVar4 = RandomUtil::Random::rand_uniform(in_stack_fffffffffffffc50);
      local_d0 = 0.0;
      local_d8 = (reference)0x0;
      for (local_dc = 0; local_dc < local_44; local_dc = local_dc + 1) {
        pvVar3 = std::vector<decay_channel_info,_std::allocator<decay_channel_info>_>::operator[]
                           (&vStack_38,(long)local_dc);
        local_d0 = pvVar3->branching_ratio + local_d0;
        if (dVar4 < local_d0) {
          local_d8 = std::vector<decay_channel_info,_std::allocator<decay_channel_info>_>::
                     operator[](&vStack_38,(long)local_dc);
          break;
        }
      }
      if (local_d8->decay_Npart == 2) {
        get_particle_mass((particle_decay *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
        get_particle_mass((particle_decay *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c);
        perform_two_body_decay
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      }
      else if (local_d8->decay_Npart == 3) {
        this_00 = (vector<particle_info,_std::allocator<particle_info>_> *)
                  get_particle_mass((particle_decay *)in_stack_fffffffffffffc50,
                                    in_stack_fffffffffffffc4c);
        __x = (value_type *)
              get_particle_mass((particle_decay *)in_stack_fffffffffffffc50,
                                in_stack_fffffffffffffc4c);
        in_stack_fffffffffffffc50 =
             (Random *)
             get_particle_mass((particle_decay *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c
                              );
        perform_three_body_decay
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(this_00,__x);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(this_00,__x);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back(this_00,__x);
      }
    }
  }
  std::pair<const_int,_particle_decay_info>::anon_struct_128_15_51aee7c3_for_second::
  ~particle_decay_info((anon_struct_128_15_51aee7c3_for_second *)in_stack_fffffffffffffc50);
  return;
}

Assistant:

void particle_decay::perform_decays(
    particle_info &mother, std::vector<particle_info> &daughter_list) {
    particle_decay_info mother_decay_info;
    if (resonance_table_.find(mother.monval) == resonance_table_.end()) {
        std::cout << "Warning: pdg " << mother.monval
                  << " not found, might be some table inconsistency"
                  << std::endl;
        return;
    } else {
        mother_decay_info = resonance_table_[mother.monval];
    }
    if (mother_decay_info.stable == 1) {
        // the particle is a stable particle
        daughter_list.push_back(mother);
        return;
    }
    // std::cout << "Decaying " << mother_decay_info->name
    //           << "(" << mother_decay_info->monval << ") ..." << std::endl;
    int N_decay_channel = mother_decay_info.decays;
    double random_local = ran_gen_ptr_->rand_uniform();
    double cumulated_branching_ratio = 0.0;
    decay_channel_info *picked_channel = NULL;
    for (int i_channel = 0; i_channel < N_decay_channel; i_channel++) {
        cumulated_branching_ratio +=
            mother_decay_info.decay_channels[i_channel].branching_ratio;
        if (cumulated_branching_ratio > random_local) {
            picked_channel = &mother_decay_info.decay_channels[i_channel];
            break;
        }
    }
    int N_decay_part = picked_channel->decay_Npart;
    if (N_decay_part == 2) {
        particle_info daughter1;
        particle_info daughter2;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        perform_two_body_decay(mother, daughter1, daughter2);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
    } else if (N_decay_part == 3) {
        particle_info daughter1;
        particle_info daughter2;
        particle_info daughter3;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        int decay_part3_monval = picked_channel->decay_part[2];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter3.monval = decay_part3_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        daughter3.mass = get_particle_mass(decay_part3_monval);
        perform_three_body_decay(mother, daughter1, daughter2, daughter3);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
        daughter_list.push_back(daughter3);
    }
}